

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O1

void TvCtrlPointPrintCommands(void)

{
  long lVar1;
  
  SampleUtil_Print("Valid Commands:\n");
  lVar1 = 0x10;
  do {
    SampleUtil_Print("  %-14s %s\n",*(undefined8 *)((long)&__frame_dummy_init_array_entry + lVar1),
                     *(undefined8 *)((long)&cmdloop_cmdlist[0].str + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1c0);
  SampleUtil_Print("\n");
  return;
}

Assistant:

void TvCtrlPointPrintCommands(void)
{
	int i;
	int numofcmds = (sizeof cmdloop_cmdlist) / sizeof(cmdloop_commands);

	SampleUtil_Print("Valid Commands:\n");
	for (i = 0; i < numofcmds; ++i) {
		SampleUtil_Print("  %-14s %s\n",
			cmdloop_cmdlist[i].str,
			cmdloop_cmdlist[i].args);
	}
	SampleUtil_Print("\n");
}